

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZKrylovEigenSolver.cpp
# Opt level: O0

void __thiscall TPZKrylovEigenSolver<float>::AdjustTargetST(TPZKrylovEigenSolver<float> *this)

{
  TPZSpectralTransform<float> *pTVar1;
  TPZEigenSolver<float> *in_RDI;
  float s;
  TPZSTShiftOrigin<float> *st;
  TPZKrylovEigenSolver<float> *in_stack_ffffffffffffffa8;
  TPZSTShiftOrigin<float> *local_48;
  TPZAutoPointer<TPZSpectralTransform<float>_> local_18;
  TPZSTShiftOrigin<float> *local_10;
  
  SpectralTransform(in_stack_ffffffffffffffa8);
  pTVar1 = TPZAutoPointer<TPZSpectralTransform<float>_>::operator->(&local_18);
  if (pTVar1 == (TPZSpectralTransform<float> *)0x0) {
    local_48 = (TPZSTShiftOrigin<float> *)0x0;
  }
  else {
    local_48 = (TPZSTShiftOrigin<float> *)
               __dynamic_cast(pTVar1,&TPZSpectralTransform<float>::typeinfo,
                              &TPZSTShiftOrigin<float>::typeinfo,0);
  }
  TPZAutoPointer<TPZSpectralTransform<float>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZSpectralTransform<float>_> *)local_48);
  if (local_48 != (TPZSTShiftOrigin<float> *)0x0) {
    local_10 = local_48;
    s = TPZEigenSolver<float>::Target(in_RDI);
    TPZSTShiftOrigin<float>::SetShift(local_48,s);
  }
  return;
}

Assistant:

void TPZKrylovEigenSolver<TVar>::AdjustTargetST()
{
  auto st =
    dynamic_cast<TPZSTShiftOrigin<TVar>*>(this->SpectralTransform().operator->());
  if(st){
    st->SetShift(this->Target());
  }
}